

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wavelet.cpp
# Opt level: O0

void idx2::ForwardCdf53(v3i *Dims3,v3i *M3,int Iter,int NLevels,u64 TformOrder,volume *Vol,
                       bool Normalize)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  uint uVar3;
  double dVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  grid *Grid;
  ulong uVar16;
  undefined1 auVar17 [16];
  double local_a80;
  double local_a68;
  double local_a50;
  double local_a38;
  double local_a20;
  double local_a08;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_968;
  grid_iterator<unsigned_char> It_9;
  grid_iterator<unsigned_char> ItEnd_9;
  grid_iterator<signed_char> It_8;
  grid_iterator<signed_char> ItEnd_8;
  grid_iterator<unsigned_short> It_7;
  grid_iterator<unsigned_short> ItEnd_7;
  grid_iterator<short> It_6;
  grid_iterator<short> ItEnd_6;
  grid_iterator<unsigned_int> It_5;
  grid_iterator<unsigned_int> ItEnd_5;
  grid_iterator<int> It_4;
  grid_iterator<int> ItEnd_4;
  grid_iterator<unsigned_long> It_3;
  grid_iterator<unsigned_long> ItEnd_3;
  grid_iterator<long> It_2;
  grid_iterator<long> ItEnd_2;
  grid_iterator<float> It_1;
  grid_iterator<float> ItEnd_1;
  grid_iterator<double> It;
  grid_iterator<double> ItEnd;
  f64 W;
  f64 Idx2;
  f64 Wy;
  f64 Wx;
  subband *S;
  int I;
  wav_basis_norms_static<16> BasisNorms;
  undefined1 local_3b8 [8];
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_Wavelet_cpp:275:5)>
  __ScopeGuard__275;
  anon_class_8_1_6ff4743c_for_Func __CleanUpFunc__275;
  array<idx2::subband> Subbands;
  undefined1 auStack_368 [4];
  int D;
  grid G;
  v3i S3;
  v3i R3;
  v3i D3;
  u64 PrevOrder;
  int Level;
  bool Normalize_local;
  volume *Vol_local;
  u64 TformOrder_local;
  int NLevels_local;
  int Iter_local;
  v3i *M3_local;
  v3i *Dims3_local;
  undefined4 local_2dc;
  undefined4 local_2d8;
  undefined4 local_2d4;
  v3i *local_2d0;
  undefined1 *local_2c8;
  undefined4 local_2bc;
  undefined4 *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  uint local_27c;
  undefined1 *local_278;
  uint local_26c;
  undefined1 *local_268;
  uint local_25c;
  undefined1 *local_258;
  uint local_24c;
  undefined1 *local_248;
  uint local_23c;
  undefined1 *local_238;
  uint local_22c;
  undefined1 *local_228;
  ulong local_220;
  anon_class_8_1_6ff4743c_for_Func *local_218;
  long local_210;
  anon_class_8_1_6ff4743c_for_Func *local_208;
  int local_1fc;
  u8 *local_1f8;
  int local_1ec;
  undefined1 *local_1e8;
  int local_1dc;
  u8 *local_1d8;
  int local_1cc;
  undefined1 *local_1c8;
  int local_1bc;
  u8 *local_1b8;
  int local_1ac;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  anon_union_8_4_6ba14846_for_v2<int>_1 *local_78;
  anon_union_8_4_6ba14846_for_v2<int>_1 *local_70;
  anon_union_8_4_6ba14846_for_v2<int>_1 *local_68;
  mallocator *local_60;
  array<idx2::subband> *local_58;
  v3i *local_50;
  undefined1 *local_48;
  v3i *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined4 *local_20;
  mallocator *local_18;
  array<idx2::subband> *local_10;
  
  PrevOrder._0_4_ = 0;
  S3.field_0.field_4.YZ.field_0 = (v2<int>)*(undefined8 *)&Dims3->field_0;
  uVar3 = (Dims3->field_0).field_0.Z;
  G.Strd._4_4_ = 1;
  S3.field_0.field_0.X = 1;
  local_2c8 = auStack_368;
  _auStack_368 = 0;
  G.super_extent.From =
       (long)(int)((Dims3->field_0).field_0.X & 0x1fffff) +
       (long)(int)((Dims3->field_0).field_0.Y & 0x1fffff) * 0x200000 +
       ((long)(int)((Dims3->field_0).field_0.Z & 0x1fffff) << 0x2a);
  local_2b8 = &local_2dc;
  local_2bc = 1;
  local_2dc = 1;
  local_2d8 = 1;
  local_2d4 = 1;
  local_20 = &local_2dc;
  G.super_extent.Dims = 0x40000200001;
  R3.field_0.field_0.X = uVar3;
  R3.field_0.field_4.YZ.field_0 = S3.field_0.field_4.YZ.field_0;
  D3.field_0.field_4.YZ.field_0 = (v2<int>)TformOrder;
  Vol_local = (volume *)TformOrder;
  local_2d0 = Dims3;
  local_50 = Dims3;
  local_48 = local_2c8;
  local_40 = Dims3;
  while( true ) {
    while( true ) {
      if (NLevels <= (int)PrevOrder) {
        if ((0 < NLevels) && (Normalize)) {
          local_60 = Mallocator();
          local_58 = (array<idx2::subband> *)&__CleanUpFunc__275;
          local_18 = Mallocator();
          __CleanUpFunc__275.Subbands = (array<idx2::subband> *)0x0;
          __ScopeGuard__275._8_8_ = (array<idx2::subband> *)&__CleanUpFunc__275;
          local_10 = (array<idx2::subband> *)&__CleanUpFunc__275;
          scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Wavelet.cpp:275:5)>
          ::scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_Wavelet_cpp:275:5)>
                         *)local_3b8,
                        (anon_class_8_1_6ff4743c_for_Func *)&__ScopeGuard__275.Dismissed);
          BuildSubbands(Dims3,NLevels,(u64)Vol_local,(array<idx2::subband> *)&__CleanUpFunc__275);
          GetCdf53NormsFast<16>();
          for (S._4_4_ = 0; local_218 = &__CleanUpFunc__275, S._4_4_ < 0; S._4_4_ = S._4_4_ + 1) {
            local_210 = (long)S._4_4_;
            local_208 = &__CleanUpFunc__275;
            Grid = (grid *)((long)__CleanUpFunc__275.Subbands + local_210 * 0x40);
            if ((Dims3->field_0).field_0.X == 1) {
              local_a08 = 1.0;
            }
            else {
              if (*(char *)((long)&Grid[2].super_extent.From + 6) == '\0') {
                local_1a8 = &stack0xfffffffffffffb28;
                local_1ac = Iter * NLevels + (int)*(char *)((long)&Grid[2].super_extent.From + 3) +
                            -1;
                if (0xf < local_1ac) {
                  __assert_fail("Idx < N",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                                ,0x20c,
                                "t &idx2::stack_array<double, 16>::operator[](int) const [t = double, N = 16]"
                               );
                }
                local_a20 = *(double *)(local_1a8 + (long)local_1ac * 8);
              }
              else {
                local_1b8 = &BasisNorms.ScalNorms.Len;
                local_1bc = Iter * NLevels + (int)*(char *)((long)&Grid[2].super_extent.From + 3);
                if (0xf < local_1bc) {
                  __assert_fail("Idx < N",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                                ,0x20c,
                                "t &idx2::stack_array<double, 16>::operator[](int) const [t = double, N = 16]"
                               );
                }
                local_a20 = *(double *)(local_1b8 + (long)local_1bc * 8);
              }
              local_a08 = local_a20;
            }
            if ((Dims3->field_0).field_0.Y == 1) {
              local_a38 = 1.0;
            }
            else {
              if (*(char *)((long)&Grid[2].super_extent.From + 7) == '\0') {
                local_1c8 = &stack0xfffffffffffffb28;
                local_1cc = Iter * NLevels + (int)*(char *)((long)&Grid[2].super_extent.From + 4) +
                            -1;
                if (0xf < local_1cc) {
                  __assert_fail("Idx < N",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                                ,0x20c,
                                "t &idx2::stack_array<double, 16>::operator[](int) const [t = double, N = 16]"
                               );
                }
                local_a50 = *(double *)(local_1c8 + (long)local_1cc * 8);
              }
              else {
                local_1d8 = &BasisNorms.ScalNorms.Len;
                local_1dc = Iter * NLevels + (int)*(char *)((long)&Grid[2].super_extent.From + 4);
                if (0xf < local_1dc) {
                  __assert_fail("Idx < N",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                                ,0x20c,
                                "t &idx2::stack_array<double, 16>::operator[](int) const [t = double, N = 16]"
                               );
                }
                local_a50 = *(double *)(local_1d8 + (long)local_1dc * 8);
              }
              local_a38 = local_a50;
            }
            if ((Dims3->field_0).field_0.Z == 1) {
              local_a68 = 1.0;
            }
            else {
              if ((char)Grid[2].super_extent.Dims == '\0') {
                local_1e8 = &stack0xfffffffffffffb28;
                local_1ec = Iter * NLevels + (int)*(char *)((long)&Grid[2].super_extent.From + 5) +
                            -1;
                if (0xf < local_1ec) {
                  __assert_fail("Idx < N",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                                ,0x20c,
                                "t &idx2::stack_array<double, 16>::operator[](int) const [t = double, N = 16]"
                               );
                }
                local_a80 = *(double *)(local_1e8 + (long)local_1ec * 8);
              }
              else {
                local_1f8 = &BasisNorms.ScalNorms.Len;
                local_1fc = Iter * NLevels + (int)*(char *)((long)&Grid[2].super_extent.From + 5);
                if (0xf < local_1fc) {
                  __assert_fail("Idx < N",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                                ,0x20c,
                                "t &idx2::stack_array<double, 16>::operator[](int) const [t = double, N = 16]"
                               );
                }
                local_a80 = *(double *)(local_1f8 + (long)local_1fc * 8);
              }
              local_a68 = local_a80;
            }
            local_a68 = local_a08 * local_a38 * local_a68;
            if (Vol->Type == float64) {
              End<double>((grid_iterator<double> *)((long)&It.N.field_0.field_3.XY.field_0 + 4),Grid
                          ,Vol);
              Begin<double>((grid_iterator<double> *)
                            ((long)&ItEnd_1.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
              while( true ) {
                local_198 = (undefined1 *)((long)&ItEnd_1.N.field_0 + 4);
                local_1a0 = (undefined1 *)((long)&It.N.field_0 + 4);
                if (ItEnd_1.N.field_0.field_4.YZ.field_0 == It.N.field_0.field_4.YZ.field_0) break;
                local_188 = (undefined1 *)((long)&ItEnd_1.N.field_0 + 4);
                local_190 = (undefined1 *)((long)&ItEnd_1.N.field_0 + 4);
                *(double *)ItEnd_1.N.field_0.field_4.YZ.field_0 =
                     *(double *)ItEnd_1.N.field_0.field_4.YZ.field_0 * local_a68;
                grid_iterator<double>::operator++
                          ((grid_iterator<double> *)
                           ((long)&ItEnd_1.N.field_0.field_3.XY.field_0 + 4));
              }
            }
            else if (Vol->Type == float32) {
              End<float>((grid_iterator<float> *)((long)&It_1.N.field_0.field_3.XY.field_0 + 4),Grid
                         ,Vol);
              Begin<float>((grid_iterator<float> *)((long)&ItEnd_2.N.field_0.field_3.XY.field_0 + 4)
                           ,Grid,Vol);
              while( true ) {
                local_178 = (undefined1 *)((long)&ItEnd_2.N.field_0 + 4);
                local_180 = (undefined1 *)((long)&It_1.N.field_0 + 4);
                if (ItEnd_2.N.field_0.field_4.YZ.field_0 == It_1.N.field_0.field_4.YZ.field_0)
                break;
                local_168 = (undefined1 *)((long)&ItEnd_2.N.field_0 + 4);
                local_170 = (undefined1 *)((long)&ItEnd_2.N.field_0 + 4);
                *(float *)ItEnd_2.N.field_0.field_4.YZ.field_0 =
                     (float)((double)*(float *)ItEnd_2.N.field_0.field_4.YZ.field_0 * local_a68);
                grid_iterator<float>::operator++
                          ((grid_iterator<float> *)((long)&ItEnd_2.N.field_0.field_3.XY.field_0 + 4)
                          );
              }
            }
            else if (Vol->Type == int64) {
              End<long>((grid_iterator<long> *)((long)&It_2.N.field_0.field_3.XY.field_0 + 4),Grid,
                        Vol);
              Begin<long>((grid_iterator<long> *)((long)&ItEnd_3.N.field_0.field_3.XY.field_0 + 4),
                          Grid,Vol);
              while( true ) {
                local_158 = (undefined1 *)((long)&ItEnd_3.N.field_0 + 4);
                local_160 = (undefined1 *)((long)&It_2.N.field_0 + 4);
                if (ItEnd_3.N.field_0.field_4.YZ.field_0 == It_2.N.field_0.field_4.YZ.field_0)
                break;
                local_148 = (undefined1 *)((long)&ItEnd_3.N.field_0 + 4);
                local_150 = (undefined1 *)((long)&ItEnd_3.N.field_0 + 4);
                *(long *)ItEnd_3.N.field_0.field_4.YZ.field_0 =
                     (long)((double)*(long *)ItEnd_3.N.field_0.field_4.YZ.field_0 * local_a68);
                grid_iterator<long>::operator++
                          ((grid_iterator<long> *)((long)&ItEnd_3.N.field_0.field_3.XY.field_0 + 4))
                ;
              }
            }
            else if (Vol->Type == uint64) {
              End<unsigned_long>((grid_iterator<unsigned_long> *)
                                 ((long)&It_3.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
              Begin<unsigned_long>
                        ((grid_iterator<unsigned_long> *)
                         ((long)&ItEnd_4.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
              while( true ) {
                local_138 = (undefined1 *)((long)&ItEnd_4.N.field_0 + 4);
                local_140 = (undefined1 *)((long)&It_3.N.field_0 + 4);
                if (ItEnd_4.N.field_0.field_4.YZ.field_0 == It_3.N.field_0.field_4.YZ.field_0)
                break;
                local_128 = (undefined1 *)((long)&ItEnd_4.N.field_0 + 4);
                auVar17._8_8_ = 0;
                auVar17._0_8_ = *(ulong *)ItEnd_4.N.field_0.field_4.YZ.field_0;
                auVar17 = vpunpckldq_avx(auVar17,_DAT_002e9df0);
                auVar17 = vsubpd_avx(auVar17,_DAT_002e9e00);
                auVar5 = vpermilpd_avx(auVar17,1);
                dVar4 = (auVar5._0_8_ + auVar17._0_8_) * local_a68;
                uVar16 = (ulong)dVar4;
                local_130 = (undefined1 *)((long)&ItEnd_4.N.field_0 + 4);
                *(ulong *)ItEnd_4.N.field_0.field_4.YZ.field_0 =
                     uVar16 | (long)(dVar4 - 9.223372036854776e+18) & (long)uVar16 >> 0x3f;
                grid_iterator<unsigned_long>::operator++
                          ((grid_iterator<unsigned_long> *)
                           ((long)&ItEnd_4.N.field_0.field_3.XY.field_0 + 4));
              }
            }
            else if (Vol->Type == int32) {
              End<int>((grid_iterator<int> *)((long)&It_4.N.field_0.field_3.XY.field_0 + 4),Grid,Vol
                      );
              Begin<int>((grid_iterator<int> *)((long)&ItEnd_5.N.field_0.field_3.XY.field_0 + 4),
                         Grid,Vol);
              while( true ) {
                local_118 = (undefined1 *)((long)&ItEnd_5.N.field_0 + 4);
                local_120 = (undefined1 *)((long)&It_4.N.field_0 + 4);
                if (ItEnd_5.N.field_0.field_4.YZ.field_0 == It_4.N.field_0.field_4.YZ.field_0)
                break;
                local_108 = (undefined1 *)((long)&ItEnd_5.N.field_0 + 4);
                local_110 = (undefined1 *)((long)&ItEnd_5.N.field_0 + 4);
                *(int *)ItEnd_5.N.field_0.field_4.YZ.field_0 =
                     (int)((double)*(int *)ItEnd_5.N.field_0.field_4.YZ.field_0 * local_a68);
                grid_iterator<int>::operator++
                          ((grid_iterator<int> *)((long)&ItEnd_5.N.field_0.field_3.XY.field_0 + 4));
              }
            }
            else if (Vol->Type == uint32) {
              End<unsigned_int>((grid_iterator<unsigned_int> *)
                                ((long)&It_5.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
              Begin<unsigned_int>((grid_iterator<unsigned_int> *)
                                  ((long)&ItEnd_6.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
              while( true ) {
                local_f8 = (undefined1 *)((long)&ItEnd_6.N.field_0 + 4);
                local_100 = (undefined1 *)((long)&It_5.N.field_0 + 4);
                if (ItEnd_6.N.field_0.field_4.YZ.field_0 == It_5.N.field_0.field_4.YZ.field_0)
                break;
                local_e8 = (undefined1 *)((long)&ItEnd_6.N.field_0 + 4);
                local_f0 = (undefined1 *)((long)&ItEnd_6.N.field_0 + 4);
                *(int *)ItEnd_6.N.field_0.field_4.YZ.field_0 =
                     (int)(long)((double)*(uint *)ItEnd_6.N.field_0.field_4.YZ.field_0 * local_a68);
                grid_iterator<unsigned_int>::operator++
                          ((grid_iterator<unsigned_int> *)
                           ((long)&ItEnd_6.N.field_0.field_3.XY.field_0 + 4));
              }
            }
            else if (Vol->Type == int16) {
              End<short>((grid_iterator<short> *)((long)&It_6.N.field_0.field_3.XY.field_0 + 4),Grid
                         ,Vol);
              Begin<short>((grid_iterator<short> *)((long)&ItEnd_7.N.field_0.field_3.XY.field_0 + 4)
                           ,Grid,Vol);
              while( true ) {
                local_d8 = (undefined1 *)((long)&ItEnd_7.N.field_0 + 4);
                local_e0 = (undefined1 *)((long)&It_6.N.field_0 + 4);
                if (ItEnd_7.N.field_0.field_4.YZ.field_0 == It_6.N.field_0.field_4.YZ.field_0)
                break;
                local_c8 = (undefined1 *)((long)&ItEnd_7.N.field_0 + 4);
                local_d0 = (undefined1 *)((long)&ItEnd_7.N.field_0 + 4);
                *(short *)ItEnd_7.N.field_0.field_4.YZ.field_0 =
                     (short)(int)((double)(int)*(short *)ItEnd_7.N.field_0.field_4.YZ.field_0 *
                                 local_a68);
                grid_iterator<short>::operator++
                          ((grid_iterator<short> *)((long)&ItEnd_7.N.field_0.field_3.XY.field_0 + 4)
                          );
              }
            }
            else if (Vol->Type == uint16) {
              End<unsigned_short>((grid_iterator<unsigned_short> *)
                                  ((long)&It_7.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
              Begin<unsigned_short>
                        ((grid_iterator<unsigned_short> *)
                         ((long)&ItEnd_8.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
              while( true ) {
                local_b8 = (undefined1 *)((long)&ItEnd_8.N.field_0 + 4);
                local_c0 = (undefined1 *)((long)&It_7.N.field_0 + 4);
                if (ItEnd_8.N.field_0.field_4.YZ.field_0 == It_7.N.field_0.field_4.YZ.field_0)
                break;
                local_a8 = (undefined1 *)((long)&ItEnd_8.N.field_0 + 4);
                local_b0 = (undefined1 *)((long)&ItEnd_8.N.field_0 + 4);
                *(short *)ItEnd_8.N.field_0.field_4.YZ.field_0 =
                     (short)(int)((double)*(ushort *)ItEnd_8.N.field_0.field_4.YZ.field_0 *
                                 local_a68);
                grid_iterator<unsigned_short>::operator++
                          ((grid_iterator<unsigned_short> *)
                           ((long)&ItEnd_8.N.field_0.field_3.XY.field_0 + 4));
              }
            }
            else if (Vol->Type == int8) {
              End<signed_char>((grid_iterator<signed_char> *)
                               ((long)&It_8.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
              Begin<signed_char>((grid_iterator<signed_char> *)
                                 ((long)&ItEnd_9.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
              while( true ) {
                local_98 = (undefined1 *)((long)&ItEnd_9.N.field_0 + 4);
                local_a0 = (undefined1 *)((long)&It_8.N.field_0 + 4);
                if (ItEnd_9.N.field_0.field_4.YZ.field_0 == It_8.N.field_0.field_4.YZ.field_0)
                break;
                local_88 = (undefined1 *)((long)&ItEnd_9.N.field_0 + 4);
                local_90 = (undefined1 *)((long)&ItEnd_9.N.field_0 + 4);
                *(char *)ItEnd_9.N.field_0.field_4.YZ.field_0 =
                     (char)(int)((double)(int)*(char *)ItEnd_9.N.field_0.field_4.YZ.field_0 *
                                local_a68);
                grid_iterator<signed_char>::operator++
                          ((grid_iterator<signed_char> *)
                           ((long)&ItEnd_9.N.field_0.field_3.XY.field_0 + 4));
              }
            }
            else if (Vol->Type == uint8) {
              End<unsigned_char>((grid_iterator<unsigned_char> *)
                                 ((long)&It_9.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
              Begin<unsigned_char>((grid_iterator<unsigned_char> *)&local_968.field_0,Grid,Vol);
              while( true ) {
                local_78 = &local_968;
                local_80 = (undefined1 *)((long)&It_9.N.field_0 + 4);
                if (local_968 ==
                    (anon_union_8_4_6ba14846_for_v2<int>_1)It_9.N.field_0.field_4.YZ.field_0) break;
                local_68 = &local_968;
                local_70 = &local_968;
                *(byte *)local_968 = (byte)(int)((double)*(byte *)local_968 * local_a68);
                grid_iterator<unsigned_char>::operator++
                          ((grid_iterator<unsigned_char> *)&local_968.field_0);
              }
            }
          }
          scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Wavelet.cpp:275:5)>
          ::~scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_Wavelet_cpp:275:5)>
                          *)local_3b8);
        }
        return;
      }
      uVar16 = (ulong)Vol_local & 3;
      uVar6 = (ulong)Vol_local & 3;
      uVar7 = (ulong)Vol_local & 3;
      uVar8 = (ulong)Vol_local & 3;
      uVar9 = (ulong)Vol_local & 3;
      uVar10 = (ulong)Vol_local & 3;
      uVar11 = (ulong)Vol_local & 3;
      uVar12 = (ulong)Vol_local & 3;
      uVar13 = (ulong)Vol_local & 3;
      uVar14 = (ulong)Vol_local & 3;
      uVar15 = (uint)Vol_local & 3;
      Vol_local = (volume *)((ulong)Vol_local >> 2);
      if (uVar15 != 3) break;
      if ((anon_union_8_4_6ba14846_for_v2<int>_1)Vol_local ==
          (anon_union_8_4_6ba14846_for_v2<int>_1)0x3) {
        Vol_local = (volume *)D3.field_0.field_4.YZ.field_0;
      }
      D3.field_0.field_4.YZ.field_0 = (v2<int>)(v2<int>)Vol_local;
      local_2a8 = auStack_368;
      local_2b0 = (undefined1 *)((long)&G.Strd + 4);
      G.super_extent.Dims =
           (long)(int)(G.Strd._4_4_ & 0x1fffff) + 0x200000 +
           ((long)(int)(S3.field_0.field_0.X & 0x1fffff) << 0x2a);
      local_288 = auStack_368;
      local_290 = (undefined1 *)((long)&R3.field_0 + 4);
      G.super_extent.From =
           (long)(int)(R3.field_0.field_0.Y & 0x1fffff) +
           (long)(int)(R3.field_0.field_0.Z & 0x1fffff) * 0x200000 +
           ((long)(int)(uVar3 & 0x1fffff) << 0x2a);
      S3.field_0.field_4.YZ.field_0 = R3.field_0.field_4.YZ.field_0;
      PrevOrder._0_4_ = (int)PrevOrder + 1;
      R3.field_0.field_0.X = uVar3;
      Vol_local = (volume *)D3.field_0.field_4.YZ.field_0;
      local_38 = local_290;
      local_28 = local_2b0;
    }
    if (Vol->Type == float64) {
      if (uVar16 == 0) {
        FLiftCdf53X<double>((grid *)auStack_368,M3,Normal,Vol);
      }
      else if (uVar15 == 1) {
        FLiftCdf53Y<double>((grid *)auStack_368,M3,Normal,Vol);
      }
      else if (uVar15 == 2) {
        FLiftCdf53Z<double>((grid *)auStack_368,M3,Normal,Vol);
      }
    }
    else if (Vol->Type == float32) {
      if (uVar6 == 0) {
        FLiftCdf53X<float>((grid *)auStack_368,M3,Normal,Vol);
      }
      else if (uVar15 == 1) {
        FLiftCdf53Y<float>((grid *)auStack_368,M3,Normal,Vol);
      }
      else if (uVar15 == 2) {
        FLiftCdf53Z<float>((grid *)auStack_368,M3,Normal,Vol);
      }
    }
    else if (Vol->Type == int64) {
      if (uVar7 == 0) {
        FLiftCdf53X<long>((grid *)auStack_368,M3,Normal,Vol);
      }
      else if (uVar15 == 1) {
        FLiftCdf53Y<long>((grid *)auStack_368,M3,Normal,Vol);
      }
      else if (uVar15 == 2) {
        FLiftCdf53Z<long>((grid *)auStack_368,M3,Normal,Vol);
      }
    }
    else if (Vol->Type == uint64) {
      if (uVar8 == 0) {
        FLiftCdf53X<unsigned_long>((grid *)auStack_368,M3,Normal,Vol);
      }
      else if (uVar15 == 1) {
        FLiftCdf53Y<unsigned_long>((grid *)auStack_368,M3,Normal,Vol);
      }
      else if (uVar15 == 2) {
        FLiftCdf53Z<unsigned_long>((grid *)auStack_368,M3,Normal,Vol);
      }
    }
    else if (Vol->Type == int32) {
      if (uVar9 == 0) {
        FLiftCdf53X<int>((grid *)auStack_368,M3,Normal,Vol);
      }
      else if (uVar15 == 1) {
        FLiftCdf53Y<int>((grid *)auStack_368,M3,Normal,Vol);
      }
      else if (uVar15 == 2) {
        FLiftCdf53Z<int>((grid *)auStack_368,M3,Normal,Vol);
      }
    }
    else if (Vol->Type == uint32) {
      if (uVar10 == 0) {
        FLiftCdf53X<unsigned_int>((grid *)auStack_368,M3,Normal,Vol);
      }
      else if (uVar15 == 1) {
        FLiftCdf53Y<unsigned_int>((grid *)auStack_368,M3,Normal,Vol);
      }
      else if (uVar15 == 2) {
        FLiftCdf53Z<unsigned_int>((grid *)auStack_368,M3,Normal,Vol);
      }
    }
    else if (Vol->Type == int16) {
      if (uVar11 == 0) {
        FLiftCdf53X<short>((grid *)auStack_368,M3,Normal,Vol);
      }
      else if (uVar15 == 1) {
        FLiftCdf53Y<short>((grid *)auStack_368,M3,Normal,Vol);
      }
      else if (uVar15 == 2) {
        FLiftCdf53Z<short>((grid *)auStack_368,M3,Normal,Vol);
      }
    }
    else if (Vol->Type == uint16) {
      if (uVar12 == 0) {
        FLiftCdf53X<unsigned_short>((grid *)auStack_368,M3,Normal,Vol);
      }
      else if (uVar15 == 1) {
        FLiftCdf53Y<unsigned_short>((grid *)auStack_368,M3,Normal,Vol);
      }
      else if (uVar15 == 2) {
        FLiftCdf53Z<unsigned_short>((grid *)auStack_368,M3,Normal,Vol);
      }
    }
    else if (Vol->Type == int8) {
      if (uVar13 == 0) {
        FLiftCdf53X<signed_char>((grid *)auStack_368,M3,Normal,Vol);
      }
      else if (uVar15 == 1) {
        FLiftCdf53Y<signed_char>((grid *)auStack_368,M3,Normal,Vol);
      }
      else if (uVar15 == 2) {
        FLiftCdf53Z<signed_char>((grid *)auStack_368,M3,Normal,Vol);
      }
    }
    else if (Vol->Type == uint8) {
      if (uVar14 == 0) {
        FLiftCdf53X<unsigned_char>((grid *)auStack_368,M3,Normal,Vol);
      }
      else if (uVar15 == 1) {
        FLiftCdf53Y<unsigned_char>((grid *)auStack_368,M3,Normal,Vol);
      }
      else if (uVar15 == 2) {
        FLiftCdf53Z<unsigned_char>((grid *)auStack_368,M3,Normal,Vol);
      }
    }
    puVar1 = (undefined1 *)((long)&R3.field_0 + 4);
    local_22c = uVar15;
    local_228 = puVar1;
    if (2 < uVar15) {
      __assert_fail("Idx < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
    }
    puVar2 = (undefined1 *)((long)&R3.field_0 + 4);
    local_23c = uVar15;
    local_238 = puVar2;
    if (2 < uVar15) {
      __assert_fail("Idx < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
    }
    uVar16 = (ulong)*(int *)(puVar2 + (long)(int)uVar15 * 4);
    puVar2 = (undefined1 *)((long)&S3.field_0 + 4);
    local_24c = uVar15;
    local_248 = puVar2;
    local_220 = uVar16;
    if (2 < uVar15) break;
    *(uint *)(puVar2 + (long)(int)uVar15 * 4) =
         *(int *)(puVar1 + (long)(int)uVar15 * 4) + (uint)((uVar16 & 1) == 0);
    local_298 = auStack_368;
    local_2a0 = (undefined1 *)((long)&S3.field_0 + 4);
    G.super_extent.From =
         (long)(int)(S3.field_0.field_0.Y & 0x1fffff) +
         (long)(int)(S3.field_0.field_0.Z & 0x1fffff) * 0x200000 +
         ((long)(int)(R3.field_0.field_0.X & 0x1fffff) << 0x2a);
    local_258 = (undefined1 *)((long)&S3.field_0 + 4);
    local_25c = uVar15;
    local_30 = local_2a0;
    if (2 < uVar15) {
      __assert_fail("Idx < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
    }
    local_268 = (undefined1 *)((long)&R3.field_0 + 4);
    local_26c = uVar15;
    if (2 < uVar15) {
      __assert_fail("Idx < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
    }
    *(int *)(local_268 + (long)(int)uVar15 * 4) =
         *(int *)(local_258 + (long)(int)uVar15 * 4) + 1 >> 1;
    puVar1 = (undefined1 *)((long)&G.Strd + 4);
    local_27c = uVar15;
    local_278 = puVar1;
    if (2 < uVar15) {
      __assert_fail("Idx < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
    }
    *(int *)(puVar1 + (long)(int)uVar15 * 4) = *(int *)(puVar1 + (long)(int)uVar15 * 4) << 1;
  }
  __assert_fail("Idx < 3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
}

Assistant:

void
ForwardCdf53(const v3i& Dims3,
             const v3i& M3,
             int Iter,
             int NLevels,
             u64 TformOrder,
             volume* Vol,
             bool Normalize)
{
  idx2_Assert(Dims3 <= Dims(*Vol));
  int Level = 0;
  u64 PrevOrder = TformOrder;
  v3i D3 = Dims3;
  v3i R3 = D3;
  v3i S3(1);
  grid G(Dims3);
  while (Level < NLevels)
  {
    idx2_Assert(TformOrder != 0);
    int D = TformOrder & 0x3;
    TformOrder >>= 2;
    if (D == 3)
    {                      // next level
      if (TformOrder == 3) // next one is the last |
        TformOrder = PrevOrder;
      else
        PrevOrder = TformOrder;
      SetStrd(&G, S3);
      SetDims(&G, D3);
      R3 = D3;
      ++Level;
    }
    else
    {
#define Body(type)                                                                                 \
  switch (D)                                                                                       \
  {                                                                                                \
    case 0:                                                                                        \
      idx2_Assert(Dims3.X > 1);                                                                    \
      FLiftCdf53X<type>(G, M3, lift_option::Normal, Vol);                                          \
      break;                                                                                       \
    case 1:                                                                                        \
      idx2_Assert(Dims3.Y > 1);                                                                    \
      FLiftCdf53Y<type>(G, M3, lift_option::Normal, Vol);                                          \
      break;                                                                                       \
    case 2:                                                                                        \
      idx2_Assert(Dims3.Z > 1);                                                                    \
      FLiftCdf53Z<type>(G, M3, lift_option::Normal, Vol);                                          \
      break;                                                                                       \
    default:                                                                                       \
      idx2_Assert(false);                                                                          \
      break;                                                                                       \
  };
      idx2_DispatchOnType(Vol->Type);
#undef Body
      R3[D] = D3[D] + IsEven(D3[D]);
      SetDims(&G, R3);
      D3[D] = (R3[D] + 1) >> 1;
      S3[D] <<= 1;
    }
  }

  /* Optionally normalize */
  if (NLevels > 0 && Normalize)
  {
    idx2_Assert(IsFloatingPoint(Vol->Type));
    idx2_RAII(array<subband>, Subbands, BuildSubbands(Dims3, NLevels, TformOrder, &Subbands));
    auto BasisNorms = GetCdf53NormsFast<16>();
    for (int I = 0; I < Size(Subbands); ++I)
    {
      subband& S = Subbands[I];
      f64 Wx = Dims3.X == 1
                 ? 1
                 : (S.LowHigh3.X == 0 ? BasisNorms.ScalNorms[Iter * NLevels + S.Level3Rev.X - 1]
                                      : BasisNorms.WaveNorms[Iter * NLevels + S.Level3Rev.X]);
      f64 Wy = Dims3.Y == 1
                 ? 1
                 : (S.LowHigh3.Y == 0 ? BasisNorms.ScalNorms[Iter * NLevels + S.Level3Rev.Y - 1]
                                      : BasisNorms.WaveNorms[Iter * NLevels + S.Level3Rev.Y]);
      f64 Idx2 = Dims3.Z == 1
                   ? 1
                   : (S.LowHigh3.Z == 0 ? BasisNorms.ScalNorms[Iter * NLevels + S.Level3Rev.Z - 1]
                                        : BasisNorms.WaveNorms[Iter * NLevels + S.Level3Rev.Z]);
      f64 W = Wx * Wy * Idx2;
#define Body(type)                                                                                 \
  auto ItEnd = End<type>(S.Grid, *Vol);                                                            \
  for (auto It = Begin<type>(S.Grid, *Vol); It != ItEnd; ++It)                                     \
    *It = type(*It * W);
      idx2_DispatchOnType(Vol->Type);
#undef Body
    }
  }
}